

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.c
# Opt level: O0

ssh_key * dsa_new_priv(ssh_keyalg *self,ptrlen pub,ptrlen priv)

{
  uint uVar1;
  ssh_keyalg *psVar2;
  ssh_hash *h_00;
  mp_int *a;
  ptrlen pVar3;
  ssh_hash *h;
  size_t local_b8;
  mp_int *ytest;
  uchar digest [20];
  ptrlen hash;
  dsa_key *dsa;
  ssh_key *sshk;
  BinarySource src [1];
  ssh_keyalg *self_local;
  ptrlen priv_local;
  ptrlen pub_local;
  
  pub_local.len = (size_t)dsa_new_pub(self,pub);
  if ((ssh_key *)pub_local.len == (ssh_key *)0x0) {
    pub_local.len = 0;
  }
  else {
    BinarySource_INIT__((BinarySource *)&sshk,priv);
    psVar2 = (ssh_keyalg *)BinarySource_get_mp_ssh2((BinarySource *)src[0]._24_8_);
    ((ssh_key *)(pub_local.len + -8))->vt = psVar2;
    if (*(int *)(src[0]._24_8_ + 0x18) == 0) {
      pVar3 = BinarySource_get_string((BinarySource *)src[0]._24_8_);
      h = (ssh_hash *)pVar3.ptr;
      local_b8 = pVar3.len;
      if (local_b8 == 0x14) {
        h_00 = ssh_hash_new(&ssh_sha1);
        BinarySink_put_mp_ssh2(h_00->binarysink_,(mp_int *)((ssh_key *)(pub_local.len + -0x28))->vt)
        ;
        BinarySink_put_mp_ssh2(h_00->binarysink_,(mp_int *)((ssh_key *)(pub_local.len + -0x20))->vt)
        ;
        BinarySink_put_mp_ssh2(h_00->binarysink_,(mp_int *)((ssh_key *)(pub_local.len + -0x18))->vt)
        ;
        ssh_hash_final(h_00,(uchar *)&ytest);
        uVar1 = smemeq(h,&ytest,0x14);
        if (uVar1 == 0) {
          dsa_freekey((ssh_key *)pub_local.len);
          return (ssh_key *)0x0;
        }
      }
      a = mp_modpow((mp_int *)((ssh_key *)(pub_local.len + -0x18))->vt,
                    (mp_int *)((ssh_key *)(pub_local.len + -8))->vt,
                    (mp_int *)((ssh_key *)(pub_local.len + -0x28))->vt);
      uVar1 = mp_cmp_eq(a,(mp_int *)((ssh_key *)(pub_local.len + -0x10))->vt);
      if (uVar1 == 0) {
        mp_free(a);
        dsa_freekey((ssh_key *)pub_local.len);
        pub_local.len = 0;
      }
      else {
        mp_free(a);
      }
    }
    else {
      dsa_freekey((ssh_key *)pub_local.len);
      pub_local.len = 0;
    }
  }
  return (ssh_key *)pub_local.len;
}

Assistant:

static ssh_key *dsa_new_priv(const ssh_keyalg *self, ptrlen pub, ptrlen priv)
{
    BinarySource src[1];
    ssh_key *sshk;
    struct dsa_key *dsa;
    ptrlen hash;
    unsigned char digest[20];
    mp_int *ytest;

    sshk = dsa_new_pub(self, pub);
    if (!sshk)
        return NULL;

    dsa = container_of(sshk, struct dsa_key, sshk);
    BinarySource_BARE_INIT_PL(src, priv);
    dsa->x = get_mp_ssh2(src);
    if (get_err(src)) {
        dsa_freekey(&dsa->sshk);
        return NULL;
    }

    /*
     * Check the obsolete hash in the old DSA key format.
     */
    hash = get_string(src);
    if (hash.len == 20) {
        ssh_hash *h = ssh_hash_new(&ssh_sha1);
        put_mp_ssh2(h, dsa->p);
        put_mp_ssh2(h, dsa->q);
        put_mp_ssh2(h, dsa->g);
        ssh_hash_final(h, digest);
        if (!smemeq(hash.ptr, digest, 20)) {
            dsa_freekey(&dsa->sshk);
            return NULL;
        }
    }

    /*
     * Now ensure g^x mod p really is y.
     */
    ytest = mp_modpow(dsa->g, dsa->x, dsa->p);
    if (!mp_cmp_eq(ytest, dsa->y)) {
        mp_free(ytest);
        dsa_freekey(&dsa->sshk);
        return NULL;
    }
    mp_free(ytest);

    return &dsa->sshk;
}